

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gls::BindInactiveAliasingAttributeTest::iterate(BindInactiveAliasingAttributeTest *this)

{
  deUint32 dVar1;
  int ndx;
  deInt32 local_2b4;
  allocator<char> local_2ad;
  int local_2ac;
  BindInactiveAliasingAttributeTest *local_2a8;
  AttribType *local_2a0;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  bindings;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  undefined1 local_260 [40];
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  int local_218 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  undefined1 local_1b8 [8];
  pointer pAStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  deUint32 local_198;
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b4 = anon_unknown_1::getMaxAttributeLocations(this->m_renderCtx);
  local_2ac = 1;
  if (this->m_arraySize != -1) {
    local_2ac = this->m_arraySize;
  }
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ndx = 0;
  local_1b8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pAStack_1b0);
  std::operator<<((ostream *)&pAStack_1b0,"GL_MAX_VERTEX_ATTRIBS: ");
  std::ostream::operator<<((ostringstream *)&pAStack_1b0,local_2b4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pAStack_1b0);
  local_2a0 = &this->m_type;
  local_2a8 = this;
  for (dVar1 = local_2b4 - (this->m_type).m_locationSize * local_2ac; -1 < (int)dVar1;
      dVar1 = dVar1 - (local_2a8->m_type).m_locationSize * local_2ac) {
    de::toString<int>(&local_1d8,&ndx);
    std::operator+(&local_1f8,"a_",&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_218,"A",&local_2ad);
    local_260[0] = true;
    std::__cxx11::string::string((string *)(local_260 + 8),(string *)local_218);
    AttributeLocationTestUtil::Attribute::Attribute
              ((Attribute *)local_1b8,local_2a0,&local_1f8,-1,(Cond *)local_260,-1);
    std::
    vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
    ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>
              (&attributes,(Attribute *)local_1b8);
    AttributeLocationTestUtil::Attribute::~Attribute((Attribute *)local_1b8);
    std::__cxx11::string::~string((string *)(local_260 + 8));
    std::__cxx11::string::~string((string *)local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    de::toString<int>(&local_1f8,&ndx);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                   "a_",&local_1f8);
    std::__cxx11::string::string((string *)local_1b8,(string *)local_260);
    local_198 = dVar1;
    std::
    vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
    ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)local_1b8);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::string::~string((string *)&local_1f8);
    local_218[0] = ndx + local_2b4;
    de::toString<int>(&local_1d8,local_218);
    std::operator+(&local_1f8,"a_",&local_1d8);
    AttributeLocationTestUtil::Cond::Cond((Cond *)local_260,COND_NEVER);
    AttributeLocationTestUtil::Attribute::Attribute
              ((Attribute *)local_1b8,local_2a0,&local_1f8,-1,(Cond *)local_260,-1);
    std::
    vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
    ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>
              (&attributes,(Attribute *)local_1b8);
    AttributeLocationTestUtil::Attribute::~Attribute((Attribute *)local_1b8);
    std::__cxx11::string::~string((string *)(local_260 + 8));
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    local_1d8._M_dataplus._M_p._0_4_ = ndx + local_2b4;
    de::toString<int>(&local_1f8,(int *)&local_1d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                   "a_",&local_1f8);
    std::__cxx11::string::string((string *)local_1b8,(string *)local_260);
    local_198 = dVar1;
    std::
    vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
    ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)local_1b8);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::string::~string((string *)&local_1f8);
    ndx = ndx + 1;
  }
  local_1b8 = (undefined1  [8])0x0;
  pAStack_1b0 = (pointer)0x0;
  local_1a8._M_allocated_capacity = 0;
  AttributeLocationTestUtil::runTest
            ((local_2a8->super_TestCase).super_TestNode.m_testCtx,local_2a8->m_renderCtx,&attributes
             ,&noBindings,&bindings,&noBindings,false,false,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)local_1b8);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)local_1b8);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&bindings);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&attributes);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&noBindings);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult BindInactiveAliasingAttributeTest::iterate (void)
{
	const vector<Bind>	noBindings;
	const deInt32		maxAttributes		= getMaxAttributeLocations(m_renderCtx);
	const int			arrayElementCount	= (m_arraySize != Attribute::NOT_ARRAY ? m_arraySize : 1);

	vector<Attribute>	attributes;
	vector<Bind>		bindings;
	int					ndx = 0;

	m_testCtx.getLog() << TestLog::Message << "GL_MAX_VERTEX_ATTRIBS: " << maxAttributes << TestLog::EndMessage;

	for (int loc = maxAttributes - arrayElementCount * m_type.getLocationSize(); loc >= 0; loc -= m_type.getLocationSize() * arrayElementCount)
	{
		attributes.push_back(Attribute(m_type, "a_" + de::toString(ndx), Attribute::LOC_UNDEF, Cond("A")));
		bindings.push_back(Bind("a_" + de::toString(ndx), loc));

		attributes.push_back(Attribute(m_type, "a_" + de::toString(ndx + maxAttributes), Attribute::LOC_UNDEF, Cond::COND_NEVER));
		bindings.push_back(Bind("a_" + de::toString(ndx + maxAttributes), loc));
		ndx++;
	}

	runTest(m_testCtx, m_renderCtx, attributes, noBindings, bindings, noBindings, false);
	return STOP;
}